

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsValidAndNotZeroAndNotIdentity(ON_Xform *this,double zero_tolerance)

{
  bool bVar1;
  double (*padVar2) [4];
  int local_34;
  double *pdStack_30;
  int i;
  double *v;
  int zero_count;
  int one_count;
  double zero_tolerance_local;
  ON_Xform *this_local;
  
  bVar1 = IsValid(this);
  if (bVar1) {
    if ((zero_tolerance < 0.0) || (1.23432101234321e+308 <= zero_tolerance)) {
      this_local._7_1_ = false;
    }
    else {
      v._4_4_ = 0;
      v._0_4_ = 0;
      pdStack_30 = (double *)this;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        if (zero_tolerance < ABS(1.0 - *pdStack_30)) {
          if (zero_tolerance < ABS(*pdStack_30)) {
            return true;
          }
          v._0_4_ = (int)v + 1;
          if (0 < v._4_4_) {
            return true;
          }
        }
        else {
          v._4_4_ = v._4_4_ + 1;
          if (0 < (int)v) {
            return true;
          }
        }
        if (zero_tolerance < ABS(pdStack_30[1])) {
          return true;
        }
        if (zero_tolerance < ABS(pdStack_30[2])) {
          return true;
        }
        padVar2 = (double (*) [4])(pdStack_30 + 4);
        if (zero_tolerance < ABS(pdStack_30[3])) {
          return true;
        }
        pdStack_30 = pdStack_30 + 5;
        if (zero_tolerance < ABS((*padVar2)[0])) {
          return true;
        }
      }
      if (ABS(1.0 - *pdStack_30) <= zero_tolerance) {
        if ((v._4_4_ == 3) || ((int)v == 3)) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else if (((int)v != 3) || (zero_tolerance < ABS(1.0 - *pdStack_30))) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Xform::IsValidAndNotZeroAndNotIdentity(
  double zero_tolerance
) const
{
  if (false == IsValid())
    return false;

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  int one_count = 0;
  int zero_count = 0;
  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if (fabs(1.0 - *v) <= zero_tolerance)
    {
      // this diagonal coefficient = 1
      one_count++;
      if (zero_count > 0)
        return true;
    }
    else if (fabs(*v) <= zero_tolerance)
    {
      // this diagonal coefficient = 0
      zero_count++;
      if (one_count > 0)
        return true;
    }
    else
    {
      // this diagonal coefficient != 1 and != 0
      return true;
    }

    // If any off diagonal coefficient is not zero, return true
    v++;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
  }

  if (!(fabs(1.0 - *v) <= zero_tolerance))
  {
    if (3 == zero_count && fabs(1.0 - *v) <= zero_tolerance)
      return false; // every matrix coefficient = 0

    // otherwise, xform[3][3] != 1 so return true.
    return true;
  }

  if (3 == one_count || 3 == zero_count)
    return false;

  return true;
}